

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmq.hpp
# Opt level: O2

__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
__thiscall
rmq<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
::query(rmq<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
        *this,__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              range_begin,
       __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
       range_end)

{
  ulong *puVar1;
  unsigned_long *puVar2;
  pointer pvVar3;
  unsigned_long *puVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var21;
  ulong uVar22;
  
  puVar2 = (this->_begin)._M_current;
  uVar19 = (long)range_begin._M_current - (long)puVar2 >> 3;
  uVar22 = (long)range_end._M_current - (long)puVar2 >> 3;
  if (uVar22 <= uVar19) {
    __assert_fail("begin_idx < end_idx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                  ,0xb5,
                  "Iterator rmq<__gnu_cxx::__normal_iterator<unsigned long *, std::vector<unsigned long>>>::query(Iterator, Iterator) [Iterator = __gnu_cxx::__normal_iterator<unsigned long *, std::vector<unsigned long>>, index_t = unsigned long]"
                 );
  }
  if (this->n < uVar22) {
    __assert_fail("end_idx <= n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                  ,0xb6,
                  "Iterator rmq<__gnu_cxx::__normal_iterator<unsigned long *, std::vector<unsigned long>>>::query(Iterator, Iterator) [Iterator = __gnu_cxx::__normal_iterator<unsigned long *, std::vector<unsigned long>>, index_t = unsigned long]"
                 );
  }
  uVar16 = uVar19 - 1;
  uVar18 = this->superblock_size;
  uVar13 = uVar16 / uVar18 + 1;
  if (puVar2 == range_begin._M_current) {
    uVar13 = 0;
  }
  uVar6 = uVar22 / uVar18;
  uVar7 = uVar6 - uVar13;
  _Var21._M_current = range_begin._M_current;
  if (uVar6 < uVar13 || uVar7 == 0) {
LAB_00173101:
    uVar7 = uVar13 - 1;
    if ((uVar7 < uVar6) && (uVar19 != uVar13 * uVar18)) {
      uVar12 = this->n_blocks_per_superblock;
      lVar14 = uVar16 / this->block_size + 1;
      uVar17 = this->block_size * lVar14;
      uVar15 = lVar14 - uVar12 * uVar7;
      if (uVar12 != uVar15) {
        uVar8 = ~uVar15 + uVar12;
        if (uVar8 == 0) {
          uVar11 = 0x40;
        }
        else {
          lVar14 = 0x3f;
          if (uVar8 != 0) {
            for (; uVar8 >> lVar14 == 0; lVar14 = lVar14 + -1) {
            }
          }
          uVar11 = (uint)lVar14 ^ 0x3f;
        }
        if (puVar2[(ulong)*(ushort *)
                           (uVar15 * 2 +
                            *(long *)&(this->block_mins).
                                      super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[0x40 - uVar11].
                                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                      ._M_impl.super__Vector_impl_data +
                           (uVar12 - (long)((1 << (-(char)uVar11 & 0x1fU)) / 2)) * uVar7 * 2) +
                   uVar18 * uVar7] < *_Var21._M_current) {
          _Var21._M_current =
               puVar2 + (ulong)*(ushort *)
                                (uVar15 * 2 +
                                 *(long *)&(this->block_mins).
                                           super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[0x40 - uVar11].
                                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                           ._M_impl.super__Vector_impl_data +
                                (uVar12 - (long)((1 << (-(char)uVar11 & 0x1fU)) / 2)) * uVar7 * 2) +
                        uVar18 * uVar7;
        }
      }
      if ((uVar19 <= uVar17 && uVar17 - uVar19 != 0) &&
         (_Var9 = std::
                  __min_element<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                            (range_begin._M_current,puVar2 + uVar17),
         *_Var9._M_current < *_Var21._M_current)) {
        _Var21 = _Var9;
      }
    }
    if (((uVar13 <= uVar6) && (uVar6 != this->n_superblocks)) &&
       (uVar18 = this->superblock_size * uVar6, uVar22 != uVar18)) {
      lVar14 = this->n_blocks_per_superblock * uVar6;
      uVar12 = uVar22 / this->block_size;
      uVar15 = uVar12 - lVar14;
      if (uVar15 != 0) {
        uVar17 = 0x3f;
        if (uVar15 != 0) {
          for (; uVar15 >> uVar17 == 0; uVar17 = uVar17 - 1) {
          }
        }
        iVar5 = 1 << ((byte)uVar17 & 0x1f);
        lVar10 = (long)(iVar5 / 2) * uVar6;
        puVar4 = (this->_begin)._M_current;
        lVar20 = *(long *)&(this->block_mins).
                           super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar17 & 0xffffffff].
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data;
        puVar1 = puVar4 + *(ushort *)(lVar20 + (lVar14 - lVar10) * 2) + uVar18;
        uVar15 = *puVar1;
        uVar17 = *_Var21._M_current;
        if (uVar15 < *_Var21._M_current) {
          _Var21._M_current = puVar1;
          uVar17 = uVar15;
        }
        puVar1 = puVar4 + *(ushort *)(lVar20 + (uVar12 - (iVar5 + lVar10)) * 2) + uVar18;
        if (*puVar1 < uVar17) {
          _Var21._M_current = puVar1;
        }
      }
      uVar12 = uVar12 * this->block_size;
      if ((uVar12 < uVar22) &&
         (_Var9 = std::
                  __min_element<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                            ((this->_begin)._M_current + uVar12,range_end._M_current),
         *_Var9._M_current < *_Var21._M_current)) {
        _Var21 = _Var9;
      }
    }
    if (uVar6 < uVar13) {
      uVar18 = this->block_size;
      uVar16 = uVar16 / uVar18 + 1;
      if (puVar2 == range_begin._M_current) {
        uVar16 = 0;
      }
      uVar6 = uVar22 / uVar18;
      uVar12 = uVar6 - uVar16;
      if (uVar16 <= uVar6 && uVar12 != 0) {
        if (uVar16 / this->n_blocks_per_superblock != uVar6 / this->n_blocks_per_superblock) {
          __assert_fail("left_b / n_blocks_per_superblock == right_b / n_blocks_per_superblock",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                        ,0x114,
                        "Iterator rmq<__gnu_cxx::__normal_iterator<unsigned long *, std::vector<unsigned long>>>::query(Iterator, Iterator) [Iterator = __gnu_cxx::__normal_iterator<unsigned long *, std::vector<unsigned long>>, index_t = unsigned long]"
                       );
        }
        uVar15 = 0x3f;
        if (uVar12 != 0) {
          for (; uVar12 >> uVar15 == 0; uVar15 = uVar15 - 1) {
          }
        }
        iVar5 = 1 << ((byte)uVar15 & 0x1f);
        if (uVar13 < 2) {
          lVar20 = 0;
          lVar14 = 0;
        }
        else {
          lVar14 = (long)(iVar5 / 2) * uVar7;
          lVar20 = uVar7 * this->superblock_size;
        }
        puVar2 = (this->_begin)._M_current;
        lVar10 = *(long *)&(this->block_mins).
                           super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar15 & 0xffffffff].
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data;
        uVar13 = puVar2[(ulong)*(ushort *)(lVar10 + (uVar16 - lVar14) * 2) + lVar20];
        uVar7 = *_Var21._M_current;
        if (uVar13 < *_Var21._M_current) {
          _Var21._M_current = puVar2 + (ulong)*(ushort *)(lVar10 + (uVar16 - lVar14) * 2) + lVar20;
          uVar7 = uVar13;
        }
        if (puVar2[(ulong)*(ushort *)(lVar10 + (uVar6 - (iVar5 + lVar14)) * 2) + lVar20] < uVar7) {
          _Var21._M_current =
               puVar2 + (ulong)*(ushort *)(lVar10 + (uVar6 - (iVar5 + lVar14)) * 2) + lVar20;
        }
        if (uVar19 < uVar16 * uVar18) {
          _Var9 = std::
                  __min_element<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                            (range_begin._M_current,puVar2 + uVar16 * uVar18);
          if (*_Var9._M_current < *_Var21._M_current) {
            _Var21 = _Var9;
          }
          uVar18 = this->block_size;
        }
        if (uVar22 <= uVar18 * uVar6) {
          return (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )_Var21._M_current;
        }
        range_begin._M_current = (this->_begin)._M_current + uVar18 * uVar6;
      }
      _Var9 = std::
              __min_element<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        (range_begin._M_current,range_end._M_current);
      if (*_Var9._M_current < *_Var21._M_current) {
        _Var21 = _Var9;
      }
    }
    return (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            )_Var21._M_current;
  }
  uVar12 = 0x3f;
  if (uVar7 != 0) {
    for (; uVar7 >> uVar12 == 0; uVar12 = uVar12 - 1) {
    }
  }
  uVar12 = uVar12 & 0xffffffff;
  pvVar3 = (this->superblock_mins).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (uVar12 < (ulong)(((long)(this->superblock_mins).
                              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3) / 0x18)) {
    lVar14 = *(long *)&pvVar3[uVar12].
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data;
    uVar7 = (long)*(pointer *)
                   ((long)&pvVar3[uVar12].
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data + 8) - lVar14 >> 3;
    if (uVar13 < uVar7) {
      uVar12 = uVar6 - (long)(1 << ((byte)uVar12 & 0x1f));
      if (uVar7 <= uVar12) {
        __assert_fail("dist < superblock_mins.size() && right_sb - (1<<dist) < superblock_mins[dist].size()"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                      ,0xcb,
                      "Iterator rmq<__gnu_cxx::__normal_iterator<unsigned long *, std::vector<unsigned long>>>::query(Iterator, Iterator) [Iterator = __gnu_cxx::__normal_iterator<unsigned long *, std::vector<unsigned long>>, index_t = unsigned long]"
                     );
      }
      _Var21._M_current = puVar2 + *(long *)(lVar14 + uVar13 * 8);
      if (puVar2[*(long *)(lVar14 + uVar12 * 8)] < puVar2[*(long *)(lVar14 + uVar13 * 8)]) {
        _Var21._M_current = puVar2 + *(long *)(lVar14 + uVar12 * 8);
      }
      goto LAB_00173101;
    }
  }
  __assert_fail("dist < superblock_mins.size() && left_sb < superblock_mins[dist].size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                ,0xc9,
                "Iterator rmq<__gnu_cxx::__normal_iterator<unsigned long *, std::vector<unsigned long>>>::query(Iterator, Iterator) [Iterator = __gnu_cxx::__normal_iterator<unsigned long *, std::vector<unsigned long>>, index_t = unsigned long]"
               );
}

Assistant:

Iterator query(Iterator range_begin, Iterator range_end) {
        // find superblocks fully contained within range
        index_t begin_idx = std::distance(_begin, range_begin);
        index_t end_idx = std::distance(_begin, range_end);
        assert(begin_idx < end_idx);
        assert(end_idx <= n);

        // round up to next superblock
        index_t left_sb  = (begin_idx - 1) / superblock_size + 1;
        if (begin_idx == 0)
            left_sb = 0;
        // round down to prev superblock
        index_t right_sb = end_idx / superblock_size;

        // init result
        Iterator min_pos = range_begin;

        // if there is at least one superblock
        if (left_sb < right_sb) {
            // get largest power of two that doesn't exceed the number of
            // superblocks from (left,right)
            index_t n_sb = right_sb - left_sb;
            unsigned int dist = floorlog2(n_sb);

            assert(dist < superblock_mins.size() && left_sb < superblock_mins[dist].size());
            min_pos = _begin + superblock_mins[dist][left_sb];
            assert(dist < superblock_mins.size() && right_sb - (1<<dist) < superblock_mins[dist].size());
            Iterator right_sb_min = _begin + superblock_mins[dist][right_sb - (1 << dist)];
            if (*min_pos > *right_sb_min) {
                min_pos = right_sb_min;
            }
        }

        // go to left -> blocks -> sub-block
        if (left_sb <= right_sb && left_sb != 0 && begin_idx != left_sb*superblock_size) {
            index_t left_b = (begin_idx - 1) / block_size + 1;
            index_t left_b_gidx = left_b * block_size;
            left_b -= (left_sb - 1)*n_blocks_per_superblock;
            index_t n_b = n_blocks_per_superblock - left_b;
            if (n_b > 0) {
                unsigned int level = ceillog2(n_b);
                index_t sb_offset = (left_sb-1)*(n_blocks_per_superblock - (1<<level)/2);
                Iterator block_min_it = _begin + block_mins[level][left_b + sb_offset] + (left_sb-1)*superblock_size;
                if (*block_min_it < *min_pos)
                    min_pos = block_min_it;
            }

            // go left into remaining block, if elements left
            if (left_b_gidx > begin_idx) {
                // linearly search (at most block_size elements)
                Iterator inblock_min_it = std::min_element(range_begin, _begin + left_b_gidx);
                if (*inblock_min_it < *min_pos) {
                    min_pos = inblock_min_it;
                }
            }
        }

        // go to right -> blocks -> sub-block
        if (left_sb <= right_sb && right_sb != n_superblocks && end_idx != right_sb*superblock_size) {
            index_t left_b = right_sb*n_blocks_per_superblock;
            index_t right_b = end_idx / block_size;
            index_t n_b = right_b - left_b;
            if (n_b > 0) {
                unsigned int dist = floorlog2(n_b);
                index_t sb_offset = right_sb*((1<<dist)/2);
                Iterator block_min_it = _begin + block_mins[dist][left_b - sb_offset] + (right_sb)*superblock_size;
                if (*block_min_it < *min_pos)
                    min_pos = block_min_it;
                block_min_it = _begin + block_mins[dist][right_b - sb_offset - (1<<dist)] + (right_sb)*superblock_size;
                if (*block_min_it < *min_pos)
                    min_pos = block_min_it;
            }

            // go right into remaining block, if elements left
            index_t left_gl_idx = right_b*block_size;
            if (left_gl_idx < end_idx) {
                // linearly search (at most block_size elements)
                Iterator inblock_min_it = std::min_element(_begin + left_gl_idx, range_end);
                if (*inblock_min_it < *min_pos) {
                    min_pos = inblock_min_it;
                }
            }
        }

        // if there are no superblocks covered (both indeces in same superblock)
        if (left_sb > right_sb) {
            index_t left_b = (begin_idx - 1) / block_size + 1;
            if (begin_idx == 0)
                left_b = 0;
            index_t right_b = end_idx / block_size;


            if (left_b < right_b) {
                // if blocks are in between: get mins of blocks in range
                // NOTE: there was a while if-else block here to handle the
                //       case if blocks would span accross the boundary of two
                //       superblocks, this should however never happen
                //       git blame this line to find where this code was removed
                // assert blocks lie in the same superblock
                assert(left_b / n_blocks_per_superblock == right_b / n_blocks_per_superblock);

                unsigned int dist = floorlog2(right_b - left_b);
                index_t sb_offset = 0;
                index_t sb_size_offset = 0;
                if (left_sb > 1) {
                    sb_offset = (left_sb-1)*((1<<dist)/2);
                    sb_size_offset = (left_sb-1)*superblock_size;
                }
                Iterator block_min_it = _begin + block_mins[dist][left_b - sb_offset] + sb_size_offset;
                if (*block_min_it < *min_pos)
                    min_pos = block_min_it;
                block_min_it = _begin + block_mins[dist][right_b - sb_offset - (1<<dist)] + sb_size_offset;
                if (*block_min_it < *min_pos)
                    min_pos = block_min_it;

                // remaining inblock
                if (begin_idx < left_b*block_size) {
                    Iterator inblock_min_it = std::min_element(range_begin, _begin + left_b*block_size);
                    if (*inblock_min_it < *min_pos) {
                        min_pos = inblock_min_it;
                    }
                }
                if (end_idx > right_b*block_size) {
                    Iterator inblock_min_it = std::min_element(_begin + right_b*block_size, range_end);
                    if (*inblock_min_it < *min_pos) {
                        min_pos = inblock_min_it;
                    }
                }
            } else {
                // no blocks at all
                Iterator inblock_min_it = std::min_element(range_begin, range_end);
                if (*inblock_min_it < *min_pos) {
                    min_pos = inblock_min_it;
                }
            }

        }

        // return the minimum found
        return min_pos;
    }